

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::hideEvent(QMenu *this,QHideEvent *param_1)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  QMenuBar *pQVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  code *local_40;
  undefined8 local_38;
  QMenu *pQStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  aboutToHide(this);
  if (this_00->eventLoop != (QEventLoop *)0x0) {
    QEventLoop::exit((int)this_00->eventLoop);
  }
  pQVar4 = (QObject *)0x0;
  QMenuPrivate::setCurrentAction(this_00,(QAction *)0x0,-1,SelectedFromElsewhere,false);
  local_40 = QFont::strikeOut;
  local_38 = 0xaaaaaaaa00000007;
  local_28 = 0xaaaaaaaaffffffff;
  pQStack_30 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
  pDVar1 = (this_00->causedPopup).widget.wp.d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this_00->causedPopup).widget.wp.value;
    }
  }
  pQVar3 = QtPrivate::qobject_cast_helper<QMenuBar*,QObject>(pQVar4);
  if (pQVar3 != (QMenuBar *)0x0) {
    QMenuBarPrivate::setCurrentAction
              (*(QMenuBarPrivate **)&(pQVar3->super_QWidget).field_0x8,(QAction *)0x0,false,false);
  }
  if (QMenuPrivate::mouseDown == this) {
    QMenuPrivate::mouseDown = (QMenu *)0x0;
  }
  this_00->field_0x420 = this_00->field_0x420 & 0x7f;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->activeMenu);
  if (bVar2) {
    pDVar1 = (this_00->activeMenu).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar4 = (QObject *)0x0;
    }
    else {
      pQVar4 = (this_00->activeMenu).wp.value;
    }
    QMenuPrivate::hideMenu(this_00,(QMenu *)pQVar4);
  }
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)&this_00->causedPopup,(QObject *)0x0);
  QWeakPointer<QObject>::assign<QObject>(&(this_00->causedPopup).action.wp,(QObject *)0x0);
  if (this_00->scroll != (QMenuScroller *)0x0) {
    QBasicTimer::stop();
  }
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::hideEvent(QHideEvent *)
{
    Q_D(QMenu);
    emit aboutToHide();
    if (d->eventLoop)
        d->eventLoop->exit();
    d->setCurrentAction(nullptr);
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::PopupMenuEnd);
    QAccessible::updateAccessibility(&event);
#endif
#if QT_CONFIG(menubar)
    if (QMenuBar *mb = qobject_cast<QMenuBar*>(d->causedPopup.widget))
        mb->d_func()->setCurrentAction(nullptr);
#endif
    if (QMenuPrivate::mouseDown == this)
        QMenuPrivate::mouseDown = nullptr;
    d->hasHadMouse = false;
    if (d->activeMenu)
        d->hideMenu(d->activeMenu);
    d->causedPopup.widget = nullptr;
    d->causedPopup.action = nullptr;
    if (d->scroll)
        d->scroll->scrollTimer.stop(); //make sure the timer stops
}